

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

bool GEO::String::to_bool(string *s)

{
  string *s_00;
  bool bVar1;
  ConversionError *this;
  allocator local_39;
  string local_38 [39];
  bool local_11;
  string *psStack_10;
  bool value;
  string *s_local;
  
  psStack_10 = s;
  bVar1 = from_string<bool>(s,&local_11);
  if (!bVar1) {
    this = (ConversionError *)__cxa_allocate_exception(0x10);
    s_00 = psStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"boolean",&local_39);
    ConversionError::ConversionError(this,s_00,(string *)local_38);
    __cxa_throw(this,&ConversionError::typeinfo,ConversionError::~ConversionError);
  }
  return (bool)(local_11 & 1);
}

Assistant:

inline bool to_bool(const std::string& s) {
            bool value;
            if(!from_string(s, value)) {
                throw ConversionError(s, "boolean");
            }
            return value;
        }